

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O0

string * usb_sysfs_friendly_name(string *__return_storage_ptr__,string *sys_usb_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [8];
  string serial;
  undefined1 local_250 [8];
  string product;
  undefined1 local_210 [8];
  string manufacturer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  istringstream local_1a0 [388];
  uint local_1c;
  string *psStack_18;
  uint device_number;
  string *sys_usb_path_local;
  
  local_1c = 0;
  psStack_18 = sys_usb_path;
  sys_usb_path_local = __return_storage_ptr__;
  std::operator+(&local_1e0,sys_usb_path,"/devnum");
  read_line(&local_1c0,&local_1e0);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)&local_1c0,_S_in);
  std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1a0,&local_1c);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&product.field_2 + 8);
  std::operator+(__return_storage_ptr___00,psStack_18,"/manufacturer");
  read_line((string *)local_210,__return_storage_ptr___00);
  std::__cxx11::string::~string((string *)(product.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&serial.field_2 + 8),psStack_18,"/product");
  read_line((string *)local_250,(string *)((long)&serial.field_2 + 8));
  std::__cxx11::string::~string((string *)(serial.field_2._M_local_buf + 8));
  std::operator+(&local_2b0,psStack_18,"/serial");
  read_line((string *)local_290,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  uVar1 = std::__cxx11::string::empty();
  if ((((uVar1 & 1) == 0) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) ||
     (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(__return_storage_ptr__,"%s %s %s",uVar2,uVar3,uVar4);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2b1);
    std::allocator<char>::~allocator(&local_2b1);
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)local_210);
  return __return_storage_ptr__;
}

Assistant:

string
usb_sysfs_friendly_name(const string& sys_usb_path)
{
    unsigned int device_number = 0;

    istringstream( read_line(sys_usb_path + "/devnum") ) >> device_number;

    string manufacturer = read_line( sys_usb_path + "/manufacturer" );

    string product = read_line( sys_usb_path + "/product" );

    string serial = read_line( sys_usb_path + "/serial" );

    if( manufacturer.empty() && product.empty() && serial.empty() )
        return "";

    return format("%s %s %s", manufacturer.c_str(), product.c_str(), serial.c_str() );
}